

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

uint32_t helper_addsur_h_ssov(CPUTriCoreState *env,uint64_t r1,uint32_t r2_l,uint32_t r2_h)

{
  uint uVar1;
  uint uVar2;
  int64_t iVar3;
  int64_t iVar4;
  int64_t iVar5;
  int64_t iVar6;
  uint32_t avf1;
  uint32_t avf0;
  uint32_t ovf1;
  uint32_t ovf0;
  int64_t result1;
  int64_t result0;
  int64_t r2_high;
  int64_t r2_low;
  int64_t mul_res1;
  int64_t mul_res0;
  uint32_t r2_h_local;
  uint32_t r2_l_local;
  uint64_t r1_local;
  CPUTriCoreState *env_local;
  
  iVar3 = sextract64(r1,0,0x20);
  iVar4 = sextract64(r1,0x20,0x20);
  iVar5 = sextract64((ulong)r2_l,0,0x20);
  iVar6 = sextract64((ulong)r2_h,0,0x20);
  avf1 = 0;
  avf0 = 0;
  result1 = (iVar5 - iVar3) + 0x8000;
  _ovf1 = iVar6 + iVar4 + 0x8000;
  uVar1 = (uint)result1;
  uVar2 = (uint)_ovf1;
  if (result1 < 0x80000000) {
    if (result1 < -0x80000000) {
      avf0 = 0x80000000;
      result1 = -0x80000000;
    }
  }
  else {
    avf0 = 0x80000000;
    result1._2_4_ = 0x7fff;
  }
  if (_ovf1 < 0x80000000) {
    if (_ovf1 < -0x80000000) {
      avf1 = 0x80000000;
      _ovf1 = -0x80000000;
    }
  }
  else {
    avf1 = 0x80000000;
    ovf1 = 0x7fffffff;
  }
  env->PSW_USB_V = avf0 | avf1;
  env->PSW_USB_SV = env->PSW_USB_V | env->PSW_USB_SV;
  env->PSW_USB_AV = uVar1 ^ uVar1 * 2 | uVar2 ^ uVar2 * 2;
  env->PSW_USB_SAV = env->PSW_USB_AV | env->PSW_USB_SAV;
  return ovf1 & 0xffff0000 | result1._2_4_ & 0xffff;
}

Assistant:

uint32_t helper_addsur_h_ssov(CPUTriCoreState *env, uint64_t r1, uint32_t r2_l,
                              uint32_t r2_h)
{
    int64_t mul_res0 = sextract64(r1, 0, 32);
    int64_t mul_res1 = sextract64(r1, 32, 32);
    int64_t r2_low = sextract64(r2_l, 0, 32);
    int64_t r2_high = sextract64(r2_h, 0, 32);
    int64_t result0, result1;
    uint32_t ovf0, ovf1;
    uint32_t avf0, avf1;

    ovf0 = ovf1 = 0;

    result0 = r2_low - mul_res0 + 0x8000;
    result1 = r2_high + mul_res1 + 0x8000;

    avf0 = result0 * 2u;
    avf0 = result0 ^ avf0;
    avf1 = result1 * 2u;
    avf1 = result1 ^ avf1;

    if (result0 > INT32_MAX) {
        ovf0 = (1 << 31);
        result0 = INT32_MAX;
    } else if (result0 < INT32_MIN) {
        ovf0 = (1 << 31);
        result0 = INT32_MIN;
    }

    if (result1 > INT32_MAX) {
        ovf1 = (1 << 31);
        result1 = INT32_MAX;
    } else if (result1 < INT32_MIN) {
        ovf1 = (1 << 31);
        result1 = INT32_MIN;
    }

    env->PSW_USB_V = ovf0 | ovf1;
    env->PSW_USB_SV |= env->PSW_USB_V;

    env->PSW_USB_AV = avf0 | avf1;
    env->PSW_USB_SAV |= env->PSW_USB_AV;

    return (result1 & 0xffff0000ULL) | ((result0 >> 16) & 0xffffULL);
}